

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O2

void __thiscall BoardView::DrawPins(BoardView *this,ImDrawList *draw)

{
  element_type *peVar1;
  Net *pNVar2;
  element_type *peVar3;
  element_type *peVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ImVec2 IVar7;
  double dVar8;
  ImVec2 IVar9;
  float fVar10;
  bool bVar11;
  bool bVar12;
  char cVar13;
  int iVar14;
  uint uVar15;
  ImGuiIO *pIVar16;
  undefined4 extraout_var;
  __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
  _Var17;
  ulong uVar18;
  int iVar19;
  ImFont *font;
  byte bVar20;
  __shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2> *__r;
  uint uVar21;
  uint32_t uVar22;
  ImFont *this_00;
  uint32_t col;
  float fVar23;
  float fVar24;
  float y;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  long lStackY_3a40;
  float local_3a2c;
  float local_3a28;
  uint local_3a20;
  uint local_3a1c;
  float local_3a18;
  undefined1 auStack_3a14 [12];
  undefined1 local_3a08 [24];
  string text;
  ImVec2 pos_net_name;
  ImVec2 pos_pin_name;
  float local_3988;
  float fStack_3984;
  ImVec2 local_3970;
  ImVec2 local_3968;
  __shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2> *local_3960;
  long local_3958;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3950;
  __shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> local_3948;
  float local_3938;
  float fStack_3934;
  float fStack_3930;
  float fStack_392c;
  ImGuiIO io;
  
  pIVar16 = ImGui::GetIO();
  ImGuiIO::ImGuiIO(&io,pIVar16);
  if ((this->config).showPins == true) {
    local_3a1c = 0xffffffff;
    local_3a20 = 0;
    if (((this->config).pinSelectMasks == true) &&
       (((this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0 ||
        ((this->m_pinHighlighted).
         super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>._M_impl.
         super__Vector_impl_data._M_finish !=
         (this->m_pinHighlighted).
         super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>._M_impl.
         super__Vector_impl_data._M_start)))) {
      local_3a1c = (this->m_colors).selectedMaskPins;
      local_3a20 = (this->m_colors).orMaskPins;
    }
    if ((this->config).slowCPU == false) {
      fVar23 = 0.0;
    }
    else {
      fVar23 = 2.0;
    }
    local_3a28 = (this->config).pinSizeThresholdLow;
    ImDrawList::ChannelsSetCurrent(draw,3);
    if ((this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      DrawNetWeb(this,draw);
    }
    iVar14 = (*this->m_board->_vptr_Board[4])();
    if (local_3a28 <= fVar23) {
      local_3a28 = fVar23;
    }
    local_3960 = (__shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2> *)
                 ((undefined8 *)CONCAT44(extraout_var,iVar14))[1];
    for (__r = *(__shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2> **)CONCAT44(extraout_var,iVar14);
        __r != local_3960; __r = __r + 1) {
      local_3a2c = __r->_M_ptr->diameter * this->m_scale;
      col = (this->m_colors).pinDefaultTextColor;
      uVar21 = (this->m_colors).pinDefaultColor;
      std::__shared_ptr<BoardElement,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Pin,void>
                ((__shared_ptr<BoardElement,(__gnu_cxx::_Lock_policy)2> *)&local_3958,__r);
      if (local_3958 == 0) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3950);
LAB_0011a0e5:
        IVar7 = CoordToScreen(this,(__r->_M_ptr->position).x,(__r->_M_ptr->position).y,1.0);
        fVar23 = IVar7.x;
        y = IVar7.y;
        local_3938 = y;
        fStack_3934 = y;
        fStack_3930 = y;
        fStack_392c = y;
        bVar11 = IsVisibleScreen(this,fVar23,y,local_3a2c,&io);
        if ((bVar11) &&
           (((this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
             (element_type *)0x0 || (local_3a28 <= local_3a2c)))) {
          _Var17 = std::
                   __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<Pin>*,std::vector<std::shared_ptr<Pin>,std::allocator<std::shared_ptr<Pin>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<Pin>const>>
                             ((this->m_pinHighlighted).
                              super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (this->m_pinHighlighted).
                              super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,__r);
          if (_Var17._M_current ==
              (this->m_pinHighlighted).
              super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            uVar21 = uVar21 & local_3a1c | local_3a20;
            local_3a18 = -NAN;
            uVar15 = 0;
          }
          else {
            dVar8 = (this->config).fontSize * 0.5;
            if ((double)local_3a2c < dVar8) {
              local_3a2c = (float)dVar8;
            }
            col = (this->m_colors).pinSelectedTextColor;
            local_3a18 = (float)(this->m_colors).pinSelectedFillColor;
            uVar21 = (this->m_colors).pinSelectedColor;
            local_3a28 = 0.0;
            uVar15 = 1;
          }
          bVar20 = (byte)uVar15;
          std::__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_3948,
                     &(__r->_M_ptr->component).
                      super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>);
          bVar11 = PartIsHighlighted(this,(shared_ptr<Component> *)&local_3948);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3948._M_refcount);
          if (bVar11) {
            uVar21 = (this->m_colors).pinDefaultColor;
            col = (this->m_colors).pinDefaultTextColor;
            local_3a28 = 0.0;
            bVar20 = 1;
            uVar15 = 0;
          }
          peVar1 = __r->_M_ptr;
          iVar14 = *(int *)&(peVar1->super_BoardElement).field_0xc;
          if (iVar14 == 4) {
            uVar21 = (this->m_colors).pinTestPadColor & local_3a1c | local_3a20;
            local_3a18 = (float)((this->m_colors).pinTestPadFillColor & local_3a1c | local_3a20);
            bVar20 = 0;
          }
          if (((peVar1->component).super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->visualmode == '\x01') {
            uVar21 = (this->m_colors).pinDefaultColor;
            col = (this->m_colors).pinDefaultTextColor;
            local_3a28 = 0.0;
            bVar20 = 1;
            uVar15 = 0;
          }
          pNVar2 = peVar1->net;
          if (iVar14 == 1 || pNVar2 == (Net *)0x0) {
            uVar22 = (this->m_colors).pinNotConnectedColor;
LAB_0011a2b3:
            uVar21 = uVar22 & local_3a1c | local_3a20;
          }
          else if (pNVar2->is_ground == true) {
            uVar22 = (this->m_colors).pinGroundColor;
            goto LAB_0011a2b3;
          }
          peVar3 = (this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          bVar11 = true;
          if ((peVar3 != (element_type *)0x0) && (pNVar2 == peVar3->net)) {
            dVar8 = (this->config).fontSize * 0.5;
            if ((double)local_3a2c < dVar8) {
              local_3a2c = (float)dVar8;
            }
            uVar21 = (this->m_colors).pinSameNetColor;
            col = (this->m_colors).pinSameNetTextColor;
            local_3a18 = (float)(this->m_colors).pinSameNetFillColor;
            local_3a28 = 0.0;
            uVar15 = 1;
            bVar11 = false;
            bVar20 = 1;
          }
          if (peVar1 == peVar3) {
            dVar8 = (this->config).fontSize * 0.5;
            if ((double)local_3a2c < dVar8) {
              local_3a2c = (float)dVar8;
            }
            uVar21 = (this->m_colors).pinSelectedColor;
            col = (this->m_colors).pinSelectedTextColor;
            local_3a18 = (float)(this->m_colors).pinSelectedFillColor;
            local_3a28 = 0.0;
            uVar15 = 1;
            bVar11 = false;
            bVar20 = 1;
          }
          bVar12 = std::operator==(&peVar1->name,"A1");
          if (bVar12) {
            uVar21 = (this->m_colors).pinA1PadColor;
            uVar15 = (uint)(uVar21 != 0);
            bVar11 = false;
            local_3a18 = (float)uVar21;
          }
          local_3a08._0_4_ = uVar15;
          bVar12 = std::operator==(&__r->_M_ptr->number,"1");
          peVar4 = (__r->_M_ptr->component).
                   super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (bVar12) {
            uVar18 = (long)(peVar4->pins).
                           super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(peVar4->pins).
                           super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)uVar18 >> 4) < (ulong)(uint)(this->config).pinA1threshold) {
            }
            else {
              uVar21 = (this->m_colors).pinA1PadColor;
              local_3a08._1_3_ = 0;
              local_3a08[0] = uVar21 != 0;
              bVar11 = false;
              local_3a18 = (float)uVar21;
            }
          }
          else {
            uVar18 = (long)(peVar4->pins).
                           super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(peVar4->pins).
                           super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
          }
          iVar14 = *(int *)&(__r->_M_ptr->super_BoardElement).field_0xc;
          fVar24 = roundf(local_3a2c);
          iVar19 = (int)fVar24;
          if (0x1f < iVar19) {
            iVar19 = 0x20;
          }
          if (iVar19 < 9) {
            iVar19 = 8;
          }
          fVar24 = local_3a2c * 0.5 + 0.5;
          bVar20 = iVar14 != 4 & bVar20 & 0x10 < uVar18;
          if (bVar20 == 1) {
            dVar8 = (this->config).fontSize * 0.5;
            if ((double)local_3a2c < dVar8) {
              local_3a2c = (float)dVar8;
            }
LAB_0011a4ed:
            cVar13 = local_3a08[0];
            if ((local_3a2c <= 3.0) || (local_3a2c <= local_3a28)) {
              if (local_3a28 < local_3a2c) {
                if (cVar13 != '\0') {
                  local_3a08._0_16_ = ZEXT416((uint)fVar24);
                  text._M_dataplus._M_p = (pointer)CONCAT44(y - fVar24,fVar23 - fVar24);
                  pos_pin_name.y = fVar24 + y;
                  pos_pin_name.x = fVar24 + fVar23;
                  ImDrawList::AddRectFilled
                            (draw,(ImVec2 *)&text,&pos_pin_name,(ImU32)local_3a18,0.0,0);
                }
                if (bVar11) {
                  text._M_dataplus._M_p = (pointer)CONCAT44(y - fVar24,fVar23 - fVar24);
                  pos_pin_name.y = fVar24 + y;
                  pos_pin_name.x = fVar24 + fVar23;
                  ImDrawList::AddRect(draw,(ImVec2 *)&text,&pos_pin_name,uVar21,0.0,0,1.0);
                }
              }
            }
            else if (((this->config).pinShapeSquare == false) && ((this->config).slowCPU != true)) {
              if (cVar13 != '\0') {
                text._M_dataplus._M_p = (pointer)IVar7;
                ImDrawList::AddCircleFilled
                          (draw,(ImVec2 *)&text,local_3a2c,(ImU32)local_3a18,iVar19);
              }
              if (bVar11) {
                text._M_dataplus._M_p = (pointer)IVar7;
                ImDrawList::AddCircle(draw,(ImVec2 *)&text,local_3a2c,uVar21,iVar19,1.0);
              }
            }
            else {
              if (cVar13 != '\0') {
                local_3a08._0_16_ = ZEXT416((uint)fVar24);
                text._M_dataplus._M_p = (pointer)CONCAT44(y - fVar24,fVar23 - fVar24);
                pos_pin_name.y = fVar24 + y;
                pos_pin_name.x = fVar24 + fVar23;
                ImDrawList::AddRectFilled
                          (draw,(ImVec2 *)&text,&pos_pin_name,(ImU32)local_3a18,0.0,0);
              }
              if (bVar11) {
                text._M_dataplus._M_p = (pointer)CONCAT44(y - fVar24,fVar23 - fVar24);
                pos_pin_name.y = fVar24 + y;
                pos_pin_name.x = fVar24 + fVar23;
                ImDrawList::AddRect(draw,(ImVec2 *)&text,&pos_pin_name,uVar21,0.0,0,1.0);
              }
            }
          }
          else {
            if (iVar14 != 4) goto LAB_0011a4ed;
            if ((local_3a2c <= 3.0) || ((this->config).slowCPU != false)) {
              if (local_3a28 < local_3a2c) {
                text._M_dataplus._M_p = (pointer)CONCAT44(y - fVar24,fVar23 - fVar24);
                pos_pin_name.y = fVar24 + y;
                pos_pin_name.x = fVar24 + fVar23;
                ImDrawList::AddRectFilled
                          (draw,(ImVec2 *)&text,&pos_pin_name,(ImU32)local_3a18,0.0,0);
              }
            }
            else {
              text._M_dataplus._M_p = (pointer)IVar7;
              ImDrawList::AddCircleFilled(draw,(ImVec2 *)&text,local_3a2c,(ImU32)local_3a18,iVar19);
              text._M_dataplus._M_p = (pointer)IVar7;
              ImDrawList::AddCircle(draw,(ImVec2 *)&text,local_3a2c,uVar21,iVar19,1.0);
            }
          }
          if ((byte)(bVar20 | 3.0 < local_3a2c & (this->config).showPinName) == 1) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &pos_pin_name,&__r->_M_ptr->name,"\n");
            std::operator+(&text,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&pos_pin_name,&__r->_M_ptr->net->name);
            std::__cxx11::string::~string((string *)&pos_pin_name);
            pIVar16 = ImGui::GetIO();
            this_00 = *(pIVar16->Fonts->Fonts).Data;
            IVar7 = ImFont::CalcTextSizeA
                              (this_00,1.0,3.4028235e+38,0.0,text._M_dataplus._M_p,(char *)0x0,
                               (char **)0x0);
            auVar5._8_4_ = extraout_XMM0_Dc;
            auVar5._0_4_ = IVar7.x;
            auVar5._4_4_ = IVar7.y;
            auVar5._12_4_ = extraout_XMM0_Dd;
            fVar24 = (local_3a2c * 1.5) / IVar7.y;
            IVar9 = ImFont::CalcTextSizeA
                              (this_00,fVar24,3.4028235e+38,0.0,(__r->_M_ptr->name)._M_dataplus._M_p
                               ,(char *)0x0,(char **)0x0);
            local_3a18 = IVar7.x;
            fVar10 = (local_3a2c * 2.125) / local_3a18;
            local_3a18 = fVar24;
            if (fVar10 <= fVar24) {
              local_3a18 = fVar10;
            }
            auStack_3a14 = auVar5._4_12_;
            IVar7 = ImFont::CalcTextSizeA
                              (this_00,local_3a18,3.4028235e+38,0.0,
                               (__r->_M_ptr->net->name)._M_dataplus._M_p,(char *)0x0,(char **)0x0);
            local_3988 = IVar9.x;
            fStack_3984 = IVar9.y;
            pos_pin_name.y = y - fStack_3984;
            pos_pin_name.x = fVar23 - local_3988 * 0.5;
            auVar6._8_4_ = extraout_XMM0_Dc_00;
            auVar6._0_4_ = IVar7.x;
            auVar6._4_4_ = IVar7.y;
            auVar6._12_4_ = extraout_XMM0_Dd_00;
            pos_net_name.x = fVar23 - IVar7.x * 0.5;
            pos_net_name.y = local_3938;
            if (this_00->FontSize * 0.75 <= fVar24) {
              font = this_00;
              if ((this_00->FontSize * 1.5 < fVar24) &&
                 (pIVar16 = ImGui::GetIO(), fVar23 = (pIVar16->Fonts->Fonts).Data[1]->FontSize,
                 this_00->FontSize <= fVar23 && fVar23 != this_00->FontSize)) {
                pIVar16 = ImGui::GetIO();
                lStackY_3a40 = 8;
                goto LAB_0011a966;
              }
            }
            else {
              pIVar16 = ImGui::GetIO();
              lStackY_3a40 = 0x10;
LAB_0011a966:
              font = *(ImFont **)((long)(pIVar16->Fonts->Fonts).Data + lStackY_3a40);
            }
            if (this_00->FontSize * 0.75 <= local_3a18) {
              if ((this_00->FontSize * 1.5 < local_3a18) &&
                 (pIVar16 = ImGui::GetIO(), fVar23 = (pIVar16->Fonts->Fonts).Data[1]->FontSize,
                 this_00->FontSize <= fVar23 && fVar23 != this_00->FontSize)) {
                pIVar16 = ImGui::GetIO();
                lStackY_3a40 = 8;
                goto LAB_0011a9d3;
              }
            }
            else {
              pIVar16 = ImGui::GetIO();
              lStackY_3a40 = 0x10;
LAB_0011a9d3:
              this_00 = *(ImFont **)((long)(pIVar16->Fonts->Fonts).Data + lStackY_3a40);
            }
            fVar23 = this->m_scale * 0.5;
            local_3a08._4_4_ = IVar7.y;
            local_3968.x = pos_net_name.x - fVar23;
            local_3968.y = pos_net_name.y;
            local_3970.x = IVar7.x + pos_net_name.x + fVar23;
            local_3970.y = (float)local_3a08._4_4_ + pos_net_name.y;
            ImDrawList::AddRectFilled
                      (draw,&local_3968,&local_3970,(this->m_colors).pinTextBackgroundColor,fVar23,0
                      );
            ImDrawList::ChannelsSetCurrent(draw,4);
            ImDrawList::AddText(draw,font,fVar24,&pos_pin_name,col,
                                (__r->_M_ptr->name)._M_dataplus._M_p,(char *)0x0,0.0,(ImVec4 *)0x0);
            ImDrawList::AddText(draw,this_00,local_3a18,&pos_net_name,col,
                                (__r->_M_ptr->net->name)._M_dataplus._M_p,(char *)0x0,0.0,
                                (ImVec4 *)0x0);
            ImDrawList::ChannelsSetCurrent(draw,3);
            std::__cxx11::string::~string((string *)&text);
            local_3a08._0_16_ = auVar6;
          }
        }
      }
      else {
        iVar14 = *(int *)(local_3958 + 8);
        iVar19 = this->m_current_side;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3950);
        if ((iVar14 == 2) || (iVar14 == iVar19)) goto LAB_0011a0e5;
      }
    }
  }
  ImVector<unsigned_short>::~ImVector(&io.InputQueueCharacters);
  return;
}

Assistant:

inline void BoardView::DrawPins(ImDrawList *draw) {

	uint32_t cmask  = 0xFFFFFFFF;
	uint32_t omask  = 0x00000000;
	float threshold = 0;
	auto io         = ImGui::GetIO();

	if (!config.showPins) return;

	/*
	 * If we have a pin selected, then it makes it
	 * easier to see where the associated pins are
	 * by masking out (alpha or channel) the other
	 * pins so they're fainter.
	 */
	if (config.pinSelectMasks) {
		if (m_pinSelected || m_pinHighlighted.size()) {
			cmask = m_colors.selectedMaskPins;
			omask = m_colors.orMaskPins;
		}
	}

	if (config.slowCPU) {
		threshold      = 2.0f;
	}
	if (config.pinSizeThresholdLow > threshold) threshold = config.pinSizeThresholdLow;

	draw->ChannelsSetCurrent(kChannelPins);

	if (m_pinSelected) DrawNetWeb(draw);

	for (auto &pin : m_board->Pins()) {
		float psz           = pin->diameter * m_scale;
		uint32_t fill_color = 0xFFFF8888; // fallback fill colour
		uint32_t text_color = m_colors.pinDefaultTextColor;
		uint32_t color      = (m_colors.pinDefaultColor & cmask) | omask;
		bool fill_pin       = false;
		bool show_text      = false;
		bool draw_ring      = true;

		// continue if pin is not visible anyway
		if (!BoardElementIsVisible(pin)) continue;

		ImVec2 pos = CoordToScreen(pin->position.x, pin->position.y);
		{
			if (!IsVisibleScreen(pos.x, pos.y, psz, io)) continue;
		}

		if ((!m_pinSelected) && (psz < threshold)) continue;

		// color & text depending on app state & pin type

		{
			/*
			 * Pins resulting from a net search
			 */
			if (contains(pin, m_pinHighlighted)) {
				if (psz < config.fontSize / 2) psz = config.fontSize / 2;
				text_color = m_colors.pinSelectedTextColor;
				fill_color = m_colors.pinSelectedFillColor;
				color      = m_colors.pinSelectedColor;
				// text_color = color = m_colors.pinSameNetColor;
				fill_pin  = true;
				show_text = true;
				draw_ring = true;
				threshold = 0;
				//				draw->AddCircle(ImVec2(pos.x, pos.y), psz * pinHaloDiameter, ImColor(0xff0000ff), 32);
			}

			/*
			 * If the part is selected, as part of search or otherwise
			 */
			if (PartIsHighlighted(pin->component)) {
				color      = m_colors.pinDefaultColor;
				text_color = m_colors.pinDefaultTextColor;
				fill_pin   = false;
				draw_ring  = true;
				show_text  = true;
				threshold  = 0;
			}

			if (pin->type == Pin::kPinTypeTestPad) {
				color      = (m_colors.pinTestPadColor & cmask) | omask;
				fill_color = (m_colors.pinTestPadFillColor & cmask) | omask;
				show_text  = false;
			}

			// If the part itself is highlighted ( CVMShowPins )
			// if (p_pin->component->visualmode == p_pin->component->CVMSelected) {
			if (pin->component->visualmode == pin->component->CVMSelected) {
				color      = m_colors.pinDefaultColor;
				text_color = m_colors.pinDefaultTextColor;
				fill_pin   = false;
				draw_ring  = true;
				show_text  = true;
				threshold  = 0;
			}

			if (!pin->net || pin->type == Pin::kPinTypeNotConnected) {
				color = (m_colors.pinNotConnectedColor & cmask) | omask;
			} else {
				if (pin->net->is_ground) color = (m_colors.pinGroundColor & cmask) | omask;
			}

			// pin is on the same net as selected pin: highlight > rest
			if (m_pinSelected && pin->net == m_pinSelected->net) {
				if (psz < config.fontSize / 2) psz = config.fontSize / 2;
				color      = m_colors.pinSameNetColor;
				text_color = m_colors.pinSameNetTextColor;
				fill_color = m_colors.pinSameNetFillColor;
				draw_ring  = false;
				fill_pin   = true;
				show_text  = true; // is this something we want? Maybe an optional thing?
				threshold  = 0;
			}

			// pin selected overwrites everything
			// if (p_pin == m_pinSelected) {
			if (pin == m_pinSelected) {
				if (psz < config.fontSize / 2) psz = config.fontSize / 2;
				color      = m_colors.pinSelectedColor;
				text_color = m_colors.pinSelectedTextColor;
				fill_color = m_colors.pinSelectedFillColor;
				draw_ring  = false;
				show_text  = true;
				fill_pin   = true;
				threshold  = 0;
			}

			// Check for BGA pin '1'
			//
			if (pin->name == "A1") {
				color = fill_color = m_colors.pinA1PadColor;
				fill_pin           = m_colors.pinA1PadColor;
				draw_ring          = false;
			}

			if ((pin->number == "1")) {
				if (pin->component->pins.size() >= static_cast<unsigned int>(config.pinA1threshold)) { // config.pinA1threshold is never negative
					color = fill_color = m_colors.pinA1PadColor;
					fill_pin           = m_colors.pinA1PadColor;
					draw_ring          = false;
				}
			}

			// don't show text if it doesn't make sense
			if (pin->component->pins.size() <= 1) show_text = false;
			if (pin->type == Pin::kPinTypeTestPad) show_text = false;
		}

		// Drawing
		{
			int segments;
			//			draw->ChannelsSetCurrent(kChannelImages);

			// for the round pin representations, choose how many circle segments need
			// based on the pin size
			segments = round(psz);
			if (segments > 32) segments = 32;
			if (segments < 8) segments = 8;
			float h = psz / 2 + 0.5f;

			/*
			 * if we're going to be showing the text of a pin, then we really
			 * should make sure that the drawn pin is at least as big as a single
			 * character so it doesn't look messy
			 */
			if ((show_text) && (psz < config.fontSize / 2)) psz = config.fontSize / 2;

			switch (pin->type) {
				case Pin::kPinTypeTestPad:
					if ((psz > 3) && (!config.slowCPU)) {
						draw->AddCircleFilled(ImVec2(pos.x, pos.y), psz, fill_color, segments);
						draw->AddCircle(ImVec2(pos.x, pos.y), psz, color, segments);
					} else if (psz > threshold) {
						draw->AddRectFilled(ImVec2(pos.x - h, pos.y - h), ImVec2(pos.x + h, pos.y + h), fill_color);
					}
					break;
				default:
					if ((psz > 3) && (psz > threshold)) {
						if (config.pinShapeSquare || config.slowCPU) {
							if (fill_pin)
								draw->AddRectFilled(ImVec2(pos.x - h, pos.y - h), ImVec2(pos.x + h, pos.y + h), fill_color);
							if (draw_ring) draw->AddRect(ImVec2(pos.x - h, pos.y - h), ImVec2(pos.x + h, pos.y + h), color);
						} else {
							if (fill_pin) draw->AddCircleFilled(ImVec2(pos.x, pos.y), psz, fill_color, segments);
							if (draw_ring) draw->AddCircle(ImVec2(pos.x, pos.y), psz, color, segments);
						}
					} else if (psz > threshold) {
						if (fill_pin) draw->AddRectFilled(ImVec2(pos.x - h, pos.y - h), ImVec2(pos.x + h, pos.y + h), fill_color);
						if (draw_ring) draw->AddRect(ImVec2(pos.x - h, pos.y - h), ImVec2(pos.x + h, pos.y + h), color);
					}
			}

			// if (p_pin == m_pinSelected) {
			//		if (pin.get() == m_pinSelected) {
			//			draw->AddCircle(ImVec2(pos.x, pos.y), psz + 1.25, m_colors.pinSelectedTextColor, segments);
			//		}

			//		if ((color == m_colors.pinSameNetColor) && (pinHalo == true)) {
			//			draw->AddCircle(ImVec2(pos.x, pos.y), psz * pinHaloDiameter, m_colors.pinHaloColor, segments,
			// config.pinHaloThickness);
			//		}

			// Show all pin names when config.showPinName is enabled and pin diameter is above threshold or show pin name only for selected part
			if ((config.showPinName && psz > 3) || show_text) {
				std::string text = pin->name + "\n" + pin->net->name;
				ImFont *font = ImGui::GetIO().Fonts->Fonts[0]; // Default font
				ImVec2 text_size_normalized = font->CalcTextSizeA(1.0f, FLT_MAX, 0.0f, text.c_str());

				float maxfontwidth = psz * 2.125/ text_size_normalized.x; // Fit horizontally with 6.75% overflow (should still avoid colliding with neighbours)
				float maxfontheight = psz * 1.5/ text_size_normalized.y; // Fit vertically with 25% top/bottom padding
				float maxfontsize = std::min(maxfontwidth, maxfontheight);

				// Font size for pin name only depends on height of text (rather than width of full text incl. net name) to scale to pin bounding box
				ImVec2 size_pin_name = font->CalcTextSizeA(maxfontheight, FLT_MAX, 0.0f, pin->name.c_str());
				// Font size for net name also depends on width of full text to avoid overflowing too much and colliding with text from other pin
				ImVec2 size_net_name = font->CalcTextSizeA(maxfontsize, FLT_MAX, 0.0f, pin->net->name.c_str());

				// Show pin name above net name, full text is centered vertically
				ImVec2 pos_pin_name   = ImVec2(pos.x - size_pin_name.x * 0.5f, pos.y - size_pin_name.y);
				ImVec2 pos_net_name   = ImVec2(pos.x - size_net_name.x * 0.5f, pos.y);

				ImFont *font_pin_name = font;
				if (maxfontheight < font->FontSize * 0.75) {
					font_pin_name = ImGui::GetIO().Fonts->Fonts[2]; // Use smaller font for pin name
				} else if (maxfontheight > font->FontSize * 1.5 && ImGui::GetIO().Fonts->Fonts[1]->FontSize > font->FontSize) {
					font_pin_name = ImGui::GetIO().Fonts->Fonts[1]; // Use larger font for pin name
				}

				ImFont *font_net_name = font;
				if (maxfontsize < font->FontSize * 0.75) {
					font_net_name = ImGui::GetIO().Fonts->Fonts[2]; // Use smaller font for net name
				} else if (maxfontsize > font->FontSize * 1.5 && ImGui::GetIO().Fonts->Fonts[1]->FontSize > font->FontSize) {
					font_net_name = ImGui::GetIO().Fonts->Fonts[1]; // Use larger font for net name
				}

				// Background rectangle
				draw->AddRectFilled(ImVec2(pos_net_name.x - m_scale * 0.5f, pos_net_name.y), // Begining of text with slight padding
										ImVec2(pos_net_name.x + size_net_name.x + m_scale * 0.5f, pos_net_name.y + size_net_name.y), // End of text with slight padding
										m_colors.pinTextBackgroundColor,
										m_scale * 0.5f/*rounding*/);

				draw->ChannelsSetCurrent(kChannelText);
				draw->AddText(font_pin_name, maxfontheight, pos_pin_name, text_color, pin->name.c_str());
				draw->AddText(font_net_name, maxfontsize, pos_net_name, text_color, pin->net->name.c_str());
				draw->ChannelsSetCurrent(kChannelPins);
			}
		}
	}
}